

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_tree.c
# Opt level: O2

yajl_val context_pop(context_t *ctx)

{
  stack_elem_t *__ptr;
  yajl_val pyVar1;
  
  __ptr = ctx->stack;
  if (__ptr == (stack_elem_t *)0x0) {
    if (ctx->errbuf == (char *)0x0) {
      pyVar1 = (yajl_val)0x0;
    }
    else {
      pyVar1 = (yajl_val)0x0;
      snprintf(ctx->errbuf,ctx->errbuf_size,"context_pop: Bottom of stack reached prematurely");
    }
  }
  else {
    ctx->stack = __ptr->next;
    pyVar1 = __ptr->value;
    free(__ptr);
  }
  return pyVar1;
}

Assistant:

static yajl_val context_pop(context_t *ctx)
{
    stack_elem_t *stack;
    yajl_val v;

    if (ctx->stack == NULL)
        RETURN_ERROR (ctx, NULL, "context_pop: "
                      "Bottom of stack reached prematurely");

    stack = ctx->stack;
    ctx->stack = stack->next;

    v = stack->value;

    free (stack);

    return (v);
}